

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism.cc
# Opt level: O3

HomomorphismResult *
gss::solve_homomorphism_problem
          (HomomorphismResult *__return_storage_ptr__,InputGraph *pattern,InputGraph *target,
          HomomorphismParams *params)

{
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *plVar3;
  _Rb_tree_color _Var4;
  RestartsSchedule RVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _Base_ptr *pp_Var8;
  undefined4 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [24];
  size_type sVar13;
  element_type *this;
  pointer ptVar14;
  pointer ptVar15;
  undefined8 uVar16;
  bool bVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  _Storage<unsigned_int,_true> _Var21;
  SearchResult SVar22;
  uint uVar23;
  uint uVar24;
  undefined8 uVar25;
  _Base_ptr p_Var26;
  _Node *p_Var27;
  long lVar28;
  void *pvVar29;
  ulong uVar30;
  allocator_type *paVar31;
  allocator_type *paVar32;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar33;
  _List_node_base *p_Var34;
  long lVar35;
  mapped_type *pmVar36;
  UnsupportedConfiguration *pUVar37;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar38;
  uint uVar39;
  HomomorphismParams *extraout_RDX;
  HomomorphismParams *extraout_RDX_00;
  HomomorphismParams *extraout_RDX_01;
  HomomorphismParams *extraout_RDX_02;
  HomomorphismParams *pHVar40;
  size_t sVar41;
  uint uVar42;
  thread *th;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar43;
  int iVar44;
  uint uVar45;
  ulong uVar46;
  ulong uVar47;
  allocator_type *paVar48;
  _List_node_base *p_Var49;
  int q;
  _Rb_tree_color __val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var50;
  atomic<bool> restart_synchroniser;
  HomomorphismAssignments assignments_copy;
  Domains domains;
  string __str;
  string by_thread_nodes;
  function<void_(unsigned_int)> work_function;
  vector<int,_std::allocator<int>_> cancel_out;
  string by_thread_propagations;
  string __str_4;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  bool done;
  string __str_3;
  HomomorphismAssignments assignments;
  HomomorphismModel model;
  vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
  searchers;
  vector<int,_std::allocator<int>_> permitted;
  undefined1 local_1721 [9];
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  local_1718;
  HomomorphismParams *local_16e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16d8;
  shared_ptr<gss::innards::Proof> local_16b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_16a8;
  undefined8 local_1688;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1680;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1660;
  _Any_data local_1658;
  shared_ptr<gss::innards::Proof> sStack_1648;
  undefined1 local_1638 [16];
  _Base_ptr local_1628;
  _Base_ptr local_1620;
  _Base_ptr p_Stack_1618;
  undefined1 local_1610 [16];
  unsigned_long_long local_1600;
  undefined1 local_15f8 [16];
  _List_node_base *local_15e8;
  data_type local_15d8;
  uint local_15c8;
  undefined2 local_15c4;
  bool local_15c2;
  bool local_15b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_15a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1588;
  vector<std::thread,_std::allocator<std::thread>_> local_1568;
  vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  local_1550;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1538;
  undefined1 local_1518 [32];
  _Base_ptr local_14f8;
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  *local_14f0;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_14e8;
  HomomorphismModel local_14e0;
  long local_1498;
  vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
  local_1490;
  pointer local_1478;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1470;
  undefined1 local_1468 [16];
  undefined1 local_1458 [8];
  undefined8 uStack_1450;
  undefined4 local_1448;
  undefined4 uStack_1444;
  undefined8 local_1440;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_1438;
  _Any_data local_1428 [2];
  _Optional_payload_base<gss::ProofOptions> local_1408;
  element_type *local_13b8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_13b0;
  bool local_13a8;
  bool local_13a0;
  _List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  local_a0;
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  local_80;
  _List_node_base local_68;
  size_t local_58;
  _List_node_base local_50;
  size_t local_40;
  
  local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  local_1721._1_8_ = pattern;
  local_16e0 = params;
  if ((params->proof_options).super__Optional_base<gss::ProofOptions,_false,_false>._M_payload.
      super__Optional_payload<gss::ProofOptions,_true,_false,_false>.
      super__Optional_payload_base<gss::ProofOptions>._M_engaged == true) {
    if (params->n_threads != 1) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with threads","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (params->clique_detection == true) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,
                 "Proof logging cannot yet be used with clique detection, use --no-clique-detection"
                 ,"");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->lackey)._M_t.
        super___uniq_ptr_impl<gss::innards::Lackey,_std::default_delete<gss::innards::Lackey>_>._M_t
        .super__Tuple_impl<0UL,_gss::innards::Lackey_*,_std::default_delete<gss::innards::Lackey>_>.
        super__Head_base<0UL,_gss::innards::Lackey_*,_false>._M_head_impl != (Lackey *)0x0) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with a lackey","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if (((params->pattern_less_constraints).
         super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ._M_impl._M_node.super__List_node_base._M_next !=
         (_List_node_base *)&params->pattern_less_constraints) ||
       ((params->target_occur_less_constraints).
        super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ._M_impl._M_node.super__List_node_base._M_next !=
        (_List_node_base *)&params->target_occur_less_constraints)) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used with less-constraints","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    if ((params->injectivity & ~NonInjective) != Injective) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,
                 "Proof logging can currently only be used with injectivity or non-injectivity","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    bVar17 = InputGraph::has_vertex_labels(pattern);
    if ((bVar17) || (bVar17 = InputGraph::has_edge_labels(pattern), bVar17)) {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Proof logging cannot yet be used on labelled graphs","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    local_1468._0_8_ = (pointer)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<gss::innards::Proof,std::allocator<gss::innards::Proof>,gss::ProofOptions_const&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1468 + 8),(Proof **)local_1468,
               (allocator<gss::innards::Proof> *)local_1638,
               (ProofOptions *)&local_16e0->proof_options);
    uVar25 = local_1468._8_8_;
    local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_1468._0_8_;
    _Var50._M_pi = local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    local_1468._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x0;
    local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar25;
    if ((_Var50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
       (std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var50._M_pi),
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_ !=
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_);
    }
    for (iVar44 = 0; iVar18 = InputGraph::size((InputGraph *)local_1721._1_8_),
        this = local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        , pattern = (InputGraph *)local_1721._1_8_, iVar44 < iVar18; iVar44 = iVar44 + 1) {
      iVar18 = InputGraph::size(target);
      local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1638._8_8_ = (int *)0x0;
      local_1468._0_8_ = local_1721._1_8_;
      uStack_1450 = std::
                    _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:438:17)>
                    ::_M_invoke;
      local_1458 = (undefined1  [8])
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:438:17)>
                   ::_M_manager;
      local_1620 = (_Base_ptr)
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
                   ::_M_invoke;
      local_1628 = (_Base_ptr)
                   std::
                   _Function_handler<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:439:17)>
                   ::_M_manager;
      local_1638._0_8_ = target;
      innards::Proof::create_cp_variable
                (this,iVar44,iVar18,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)local_1468,
                 (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                  *)local_1638);
      if (local_1628 != (_Base_ptr)0x0) {
        (*(code *)local_1628)
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1638,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1638,3);
      }
      if (local_1458 != (undefined1  [8])0x0) {
        (*(code *)local_1458)
                  ((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1468,
                   (function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(int)>
                    *)local_1468,3);
      }
    }
    if (local_16e0->injectivity == Injective) {
      iVar44 = InputGraph::size((InputGraph *)local_1721._1_8_);
      iVar18 = InputGraph::size(target);
      innards::Proof::create_injectivity_constraints(this,iVar44,iVar18);
    }
    for (iVar44 = 0; iVar18 = InputGraph::size(pattern), iVar44 < iVar18; iVar44 = iVar44 + 1) {
      iVar18 = 0;
      while (local_14e0._imp._M_t.
             super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl.
             _0_4_ = iVar18, iVar19 = InputGraph::size(target), iVar18 < iVar19) {
        innards::Proof::start_adjacency_constraints_for
                  (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,iVar44,
                   (int)local_14e0._imp._M_t.
                        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                        _M_head_impl);
        for (iVar18 = 0; iVar19 = InputGraph::size(pattern), iVar18 < iVar19; iVar18 = iVar18 + 1) {
          bVar17 = InputGraph::adjacent(pattern,iVar44,iVar18);
          if (bVar17) {
            iVar19 = 0;
            local_1458 = (undefined1  [8])0x0;
            local_1628 = (_Base_ptr)0x0;
            local_1468._0_8_ =
                 (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x0;
            local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_1638._0_8_ = (InputGraph *)0x0;
            local_1638._8_8_ = (int *)0x0;
            while( true ) {
              local_1718._M_impl._0_4_ = iVar19;
              iVar20 = InputGraph::size(target);
              if (iVar20 <= iVar19) break;
              bVar17 = InputGraph::adjacent
                                 (target,(int)local_14e0._imp._M_t.
                                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                              .
                                              super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                              ._M_head_impl,local_1718._M_impl._0_4_);
              if (bVar17) {
                if ((undefined1  [8])local_1468._8_8_ == local_1458) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)local_1468,
                             (iterator)local_1468._8_8_,(int *)&local_1718);
                }
                else {
                  *(undefined4 *)local_1468._8_8_ = local_1718._M_impl._0_4_;
                  local_1468._8_8_ = local_1468._8_8_ + 4;
                }
                if ((int)local_14e0._imp._M_t.
                         super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                         .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                         _M_head_impl == local_1718._M_impl._0_4_) {
                  if ((_Base_ptr)local_1638._8_8_ == local_1628) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_1638,
                               (iterator)local_1638._8_8_,(int *)&local_14e0);
                  }
                  else {
                    *(undefined4 *)local_1638._8_8_ = local_1718._M_impl._0_4_;
                    local_1638._8_8_ = local_1638._8_8_ + 4;
                  }
                }
              }
              iVar19 = local_1718._M_impl._0_4_ + 1;
            }
            innards::Proof::create_adjacency_constraint
                      (local_16b8.
                       super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       iVar44,iVar18,
                       (int)local_14e0._imp._M_t.
                            super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                            .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                            _M_head_impl,(vector<int,_std::allocator<int>_> *)local_1468,
                       (vector<int,_std::allocator<int>_> *)local_1638,false);
            if ((InputGraph *)local_1638._0_8_ != (InputGraph *)0x0) {
              operator_delete((void *)local_1638._0_8_,(long)local_1628 - local_1638._0_8_);
            }
            pattern = (InputGraph *)local_1721._1_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1468._0_8_ !=
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0) {
              operator_delete((void *)local_1468._0_8_,(long)local_1458 - local_1468._0_8_);
            }
          }
        }
        if (local_16e0->induced == true) {
          for (iVar18 = 0; iVar19 = InputGraph::size(pattern), iVar18 < iVar19; iVar18 = iVar18 + 1)
          {
            if ((iVar18 != iVar44) &&
               (bVar17 = InputGraph::adjacent(pattern,iVar44,iVar18), !bVar17)) {
              iVar19 = 0;
              local_1458 = (undefined1  [8])0x0;
              local_1468._0_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x0;
              local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              while( true ) {
                local_1638._0_4_ = iVar19;
                iVar20 = InputGraph::size(target);
                if (iVar20 <= iVar19) break;
                if (((int)local_14e0._imp._M_t.
                          super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                          .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                          _M_head_impl != local_1638._0_4_) &&
                   (bVar17 = InputGraph::adjacent
                                       (target,(int)local_14e0._imp._M_t.
                                                                                                        
                                                  super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                                                  .
                                                  super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>
                                                  ._M_head_impl,local_1638._0_4_), !bVar17)) {
                  if ((undefined1  [8])local_1468._8_8_ == local_1458) {
                    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)local_1468,
                               (iterator)local_1468._8_8_,(int *)local_1638);
                  }
                  else {
                    *(undefined4 *)local_1468._8_8_ = local_1638._0_4_;
                    local_1468._8_8_ = local_1468._8_8_ + 4;
                  }
                }
                iVar19 = local_1638._0_4_ + 1;
              }
              local_1628 = (_Base_ptr)0x0;
              local_1638._0_8_ = (InputGraph *)0x0;
              local_1638._8_8_ = (int *)0x0;
              innards::Proof::create_adjacency_constraint
                        (local_16b8.
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         iVar44,iVar18,
                         (int)local_14e0._imp._M_t.
                              super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                              .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                              _M_head_impl,(vector<int,_std::allocator<int>_> *)local_1468,
                         (vector<int,_std::allocator<int>_> *)local_1638,true);
              if ((InputGraph *)local_1638._0_8_ != (InputGraph *)0x0) {
                operator_delete((void *)local_1638._0_8_,(long)local_1628 - local_1638._0_8_);
              }
              pattern = (InputGraph *)local_1721._1_8_;
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1468._0_8_ !=
                  (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x0) {
                operator_delete((void *)local_1468._0_8_,(long)local_1458 - local_1468._0_8_);
              }
            }
          }
        }
        iVar18 = (int)local_14e0._imp._M_t.
                      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>.
                      _M_head_impl + 1;
      }
    }
    innards::Proof::finalise_model
              (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
  bVar17 = innards::is_nonshrinking(local_16e0);
  if (bVar17) {
    iVar44 = InputGraph::size(pattern);
    iVar18 = InputGraph::size(target);
    if (iVar18 < iVar44) {
      if ((pointer)local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != (pointer)0x0) {
        innards::Proof::failure_due_to_pattern_bigger_than_target
                  (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        innards::Proof::finish_unsat_proof
                  (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      *(undefined8 *)&(__return_storage_ptr__->mapping)._M_t._M_impl = 0;
      *(undefined8 *)&(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header
           = 0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)0x0;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)0x0;
      p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &p_Var1->_M_header;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           &p_Var1->_M_header;
      *(undefined1 (*) [16])
       &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           ZEXT416(0) << 0x40;
      __return_storage_ptr__->propagations = 0;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_prev =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node.super__List_node_base._M_next =
           (_List_node_base *)&__return_storage_ptr__->extra_stats;
      (__return_storage_ptr__->extra_stats).
      super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl._M_node._M_size = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_data.la[0] = 0;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_limbs = 1;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_sign = false;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_internal = true;
      (__return_storage_ptr__->solution_count).m_backend.
      super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
      .m_alias = false;
      __return_storage_ptr__->complete = false;
      goto LAB_00123658;
    }
  }
  if (((((local_16e0->injectivity == NonInjective) &&
        (bVar17 = InputGraph::has_vertex_labels(pattern), !bVar17)) &&
       (bVar17 = InputGraph::has_edge_labels(pattern), !bVar17)) &&
      ((bVar17 = InputGraph::loopy(target), bVar17 && (local_16e0->count_solutions == false)))) &&
     ((local_16e0->enumerate_callback).super__Function_base._M_manager == (_Manager_type)0x0)) {
    p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
    plVar3 = &__return_storage_ptr__->extra_stats;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->nodes = 0;
    __return_storage_ptr__->propagations = 0;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar3;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar3;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    __return_storage_ptr__->complete = false;
    std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[27]>
              ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar3,
               (char (*) [27])"used_loops_property = true");
    __return_storage_ptr__->complete = true;
    local_1468._0_4_ = 0xffffffff;
    for (iVar44 = 0; iVar18 = InputGraph::size(target), iVar44 < iVar18; iVar44 = iVar44 + 1) {
      bVar17 = InputGraph::adjacent(target,iVar44,iVar44);
      if (bVar17) {
        local_1468._0_4_ = iVar44;
        break;
      }
    }
    iVar44 = 0;
    while( true ) {
      local_1638._0_4_ = iVar44;
      iVar18 = InputGraph::size(pattern);
      if (iVar18 <= iVar44) break;
      std::
      _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
      ::_M_emplace_unique<int&,int&>
                ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                  *)__return_storage_ptr__,(int *)local_1638,(int *)local_1468);
      iVar44 = local_1638._0_4_ + 1;
    }
    boost::multiprecision::backends::
    eval_increment<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>
              (&(__return_storage_ptr__->solution_count).m_backend);
    goto LAB_00123658;
  }
  bVar17 = innards::can_use_clique(local_16e0);
  if ((bVar17) && (bVar17 = innards::is_simple_clique(pattern), pHVar40 = local_16e0, bVar17)) {
    uStack_1450._4_1_ = 0;
    uStack_1444 = uStack_1444 & 0xffffff00;
    local_1440 = (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                  )0x0;
    local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1458 = (undefined1  [8])0x0;
    aStack_1438._M_allocated_capacity = 0x1ffffffff;
    aStack_1438._M_local_buf[8] = false;
    local_1428[0]._M_unused._M_object = (void *)0x0;
    local_1428[0]._8_8_ = 0;
    local_1428[1]._0_8_ = (_Manager_type)0x0;
    local_1428[1]._8_8_ = (_Invoker_type)0x0;
    local_1408._M_engaged = false;
    local_13a0 = false;
    local_13b8 = (element_type *)0x0;
    _Stack_13b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_13a8 = false;
    local_1468._0_8_ =
         (local_16e0->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1468 + 8),
               &(local_16e0->timeout).super___shared_ptr<gss::Timeout,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    local_1458 = (undefined1  [8])(pHVar40->start_time).__d.__r;
    _Var21._M_value = InputGraph::size(pattern);
    uVar25 = uStack_1450;
    uStack_1450._0_4_ = _Var21._M_value;
    uVar16 = uStack_1450;
    uStack_1450._4_1_ = SUB81(uVar25,4);
    bVar17 = (bool)uStack_1450._4_1_ == false;
    uStack_1450 = (code *)uVar16;
    if (bVar17) {
      uStack_1450._5_3_ = SUB83(uVar25,5);
      uStack_1450._4_1_ = true;
    }
    uVar25 = operator_new(8);
    *(undefined ***)uVar25 = &PTR__RestartsSchedule_001a0670;
    if ((_Head_base<0UL,_gss::RestartsSchedule_*,_false>)local_1440 !=
        (_Head_base<0UL,_gss::RestartsSchedule_*,_false>)0x0) {
      RVar5._vptr_RestartsSchedule = *(_func_int ***)local_1440;
      local_1440 = uVar25;
      (*RVar5._vptr_RestartsSchedule[1])();
      uVar25 = local_1440;
    }
    local_1440 = uVar25;
    solve_clique_problem((CliqueResult *)local_1638,target,(CliqueParams *)local_1468);
    iVar44 = 0;
    p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
    plVar3 = &__return_storage_ptr__->extra_stats;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
    ;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)0x0;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         &p_Var1->_M_header;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    __return_storage_ptr__->nodes = 0;
    __return_storage_ptr__->propagations = 0;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar3;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar3;
    (__return_storage_ptr__->extra_stats).
    super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl._M_node._M_size = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_data.la[0] = 0;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_limbs = 1;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_sign = false;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_internal = true;
    (__return_storage_ptr__->solution_count).m_backend.
    super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    .m_alias = false;
    __return_storage_ptr__->complete = false;
    if (local_1620 != (_Base_ptr)(local_1638 + 8)) {
      p_Var26 = local_1620;
      do {
        local_14e0._imp._M_t.
        super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        ._M_t.
        super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
        .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl._0_4_ =
             iVar44;
        std::
        _Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
        ::_M_emplace_unique<int,int_const&>
                  ((_Rb_tree<int,std::pair<int_const,int>,std::_Select1st<std::pair<int_const,int>>,std::less<int>,std::allocator<std::pair<int_const,int>>>
                    *)__return_storage_ptr__,(int *)&local_14e0,(int *)(p_Var26 + 1));
        iVar18 = InputGraph::size((InputGraph *)local_1721._1_8_);
        iVar44 = iVar44 + 1;
        if (iVar18 <= iVar44) break;
        p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26);
      } while (p_Var26 != (_Base_ptr)(local_1638 + 8));
    }
    __return_storage_ptr__->nodes = local_1610._8_8_;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(plVar3,(_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)(local_15f8 + 8));
    p_Var27 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
              _M_create_node<char_const(&)[26]>
                        ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar3,
                         (char (*) [26])"used_clique_solver = true");
    std::__detail::_List_node_base::_M_hook(&p_Var27->super__List_node_base);
    psVar2 = &(__return_storage_ptr__->extra_stats).
              super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl._M_node._M_size;
    *psVar2 = *psVar2 + 1;
    __return_storage_ptr__->complete = (bool)local_15d8.ld.capacity._0_1_;
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_15f8 + 8));
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
               local_1638);
    if (_Stack_13b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_13b0._M_pi);
    }
    if (local_1408._M_engaged == true) {
      std::_Optional_payload_base<gss::ProofOptions>::_M_destroy(&local_1408);
    }
    if ((_Manager_type)local_1428[1]._0_8_ != (_Manager_type)0x0) {
      (*(code *)local_1428[1]._0_8_)(local_1428,local_1428,3);
    }
    if ((RestartsSchedule *)local_1440 != (RestartsSchedule *)0x0) {
      (*(*(_func_int ***)local_1440)[1])();
    }
    local_1440 = (_Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                  )0x0;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1468._8_8_);
    }
    goto LAB_00123658;
  }
  pHVar40 = local_16e0;
  innards::HomomorphismModel::HomomorphismModel(&local_14e0,target,pattern,local_16e0,&local_16b8);
  bVar17 = innards::HomomorphismModel::prepare(&local_14e0);
  p_Var1 = &(__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header;
  plVar3 = &__return_storage_ptr__->extra_stats;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  __return_storage_ptr__->nodes = 0;
  __return_storage_ptr__->propagations = 0;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)plVar3;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)plVar3;
  (__return_storage_ptr__->extra_stats).
  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl._M_node._M_size = 0;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_data.la[0] = 0;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_limbs = 1;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_sign = false;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_internal = true;
  (__return_storage_ptr__->solution_count).m_backend.
  super_cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  .m_alias = false;
  __return_storage_ptr__->complete = false;
  if (bVar17) {
    local_14f0 = (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                  *)&__return_storage_ptr__->solution_count;
    local_14f8 = &p_Var1->_M_header;
    local_14e8 = plVar3;
    if (pHVar40->n_threads == 1) {
      local_1658._8_8_ = pHVar40;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_1620 = (_Base_ptr)(local_1638 + 8);
      local_15f8._0_8_ = local_15f8;
      local_1610 = ZEXT816(0) << 0x20;
      local_1638._8_8_ = local_1638._8_8_ & 0xffffffff00000000;
      local_1628 = (_Base_ptr)0x0;
      local_1600 = 0;
      local_15e8 = (_List_node_base *)0x0;
      local_15d8.la[0] = 0;
      local_15c8 = 1;
      local_15c4._0_1_ = false;
      local_15c4._1_1_ = true;
      local_15c2 = false;
      local_15b8 = false;
      local_1468._8_8_ = local_1468._8_8_ & 0xffffffffffffff00;
      local_1658._M_unused._M_object = &local_14e0;
      p_Stack_1618 = local_1620;
      local_15f8._8_8_ = local_15f8._0_8_;
      innards::SVOBitset::SVOBitset((SVOBitset *)local_1458,local_14e0.target_size,0);
      std::
      vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
      vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              *)&local_16d8,(ulong)local_14e0.pattern_size,(value_type *)local_1468,
             (allocator_type *)&local_1718);
      if ((0x10 < (uint)local_1408._M_payload._48_4_) && (local_1458 != (undefined1  [8])0x0)) {
        operator_delete__((void *)local_1458);
      }
      bVar17 = innards::HomomorphismModel::initialise_domains
                         ((HomomorphismModel *)local_1658._M_unused._0_8_,
                          (vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
                           *)&local_16d8);
      if (bVar17) {
        local_1518._0_8_ = (pointer)0x0;
        local_1518._8_8_ = (pointer)0x0;
        local_1518._16_8_ = (pointer)0x0;
        std::
        vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
        ::reserve((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                   *)local_1518,(ulong)*(uint *)(local_1658._M_unused._M_function_pointer + 0xc));
        lVar28 = std::chrono::_V2::steady_clock::now();
        local_1550.
        super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
        local_1718._M_impl._0_16_ = ZEXT816(0);
        local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
             (_Base_ptr)
             std::
             _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
             ::_M_manager;
        local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
             (_Base_ptr)
             std::
             _Function_handler<bool_(const_gss::innards::HomomorphismAssignments_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:106:32)>
             ::_M_invoke;
        innards::HomomorphismSearcher::HomomorphismSearcher
                  ((HomomorphismSearcher *)local_1468,
                   (HomomorphismModel *)local_1658._M_unused._0_8_,
                   (HomomorphismParams *)local_1658._8_8_,(DuplicateSolutionFilterer *)&local_1718,
                   &sStack_1648);
        if (local_1718._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
          (*(code *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent)
                    (&local_1718,&local_1718,3);
        }
        bVar17 = false;
        uVar42 = 0;
        while (!bVar17) {
          uVar42 = uVar42 + 1;
          p_Var34 = &local_68;
          while (p_Var34 = p_Var34->_M_next, p_Var49 = &local_50, p_Var34 != &local_68) {
            bVar17 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var34 + 1),
                                (anon_class_16_2_c26f802a *)&local_16d8);
            if (bVar17) goto LAB_00121dac;
          }
          while (p_Var49 = p_Var49->_M_next, p_Var49 != &local_50) {
            bVar17 = innards::
                     Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                     ::
                     apply_one_new_nogood<(anonymous_namespace)::SequentialSolver::solve()::_lambda(gss::innards::HomomorphismAssignment_const&)_1_>
                               ((Watches<gss::innards::HomomorphismAssignment,gss::innards::HomomorphismAssignmentWatchTable>
                                 *)&local_a0,(iterator *)(p_Var49 + 1),
                                (anon_class_16_2_c26f802a *)&local_16d8);
            if (bVar17) goto LAB_00121dac;
          }
          local_1550.
          super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
          ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
          p_Var34 = local_68._M_next;
          while (p_Var34 != &local_68) {
            p_Var49 = p_Var34->_M_next;
            operator_delete(p_Var34,0x18);
            p_Var34 = p_Var49;
          }
          local_58 = 0;
          local_68._M_next = &local_68;
          local_68._M_prev = &local_68;
          p_Var34 = local_50._M_next;
          while (p_Var34 != &local_50) {
            p_Var49 = p_Var34->_M_next;
            operator_delete(p_Var34,0x18);
            p_Var34 = p_Var49;
          }
          local_1600 = local_1600 + 1;
          local_40 = 0;
          local_50._M_next = &local_50;
          local_50._M_prev = &local_50;
          bVar17 = innards::HomomorphismSearcher::propagate
                             ((HomomorphismSearcher *)local_1468,true,(Domains *)&local_16d8,
                              (HomomorphismAssignments *)local_1518,
                              ((HomomorphismParams *)local_1658._8_8_)->propagate_using_lackey !=
                              Never);
          if (bVar17) {
            std::
            vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
            ::vector((vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)&local_1718,
                     (vector<gss::innards::HomomorphismAssignmentInformation,_std::allocator<gss::innards::HomomorphismAssignmentInformation>_>
                      *)local_1518);
            SVar22 = innards::HomomorphismSearcher::restarting_search
                               ((HomomorphismSearcher *)local_1468,
                                (HomomorphismAssignments *)&local_1718,(Domains *)&local_16d8,
                                (unsigned_long_long *)(local_1610 + 8),&local_1600,
                                (loooong *)&local_15d8.ld,0,
                                (((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                                   *)(local_1658._8_8_ + 0x50))->_M_t).
                                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)
            ;
            switch(SVar22) {
            case Aborted:
              bVar17 = true;
              local_1550.
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
              break;
            case Satisfiable:
              innards::HomomorphismSearcher::save_result
                        ((HomomorphismSearcher *)local_1468,(HomomorphismAssignments *)&local_1718,
                         (HomomorphismResult *)local_1638);
            case Unsatisfiable:
            case UnsatisfiableAndBackjumpUsingLackey:
            case SatisfiableButKeepGoing:
              bVar17 = true;
              local_15b8 = true;
              local_1550.
              super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
              break;
            default:
              bVar17 = false;
            }
            if ((void *)local_1718._M_impl._0_8_ != (void *)0x0) {
              operator_delete((void *)local_1718._M_impl._0_8_,
                              (long)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent -
                              local_1718._M_impl._0_8_);
            }
          }
          else {
            if ((pointer)sStack_1648.
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                != (pointer)0x0) {
              innards::Proof::root_propagation_failed
                        (sStack_1648.
                         super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ;
            }
            bVar17 = true;
            local_15b8 = true;
            local_1550.
            super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
            ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
          }
          (*((((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
              (local_1658._8_8_ + 0x50))->_M_t).
             super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
             ._M_t.
             super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
             .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
            _vptr_RestartsSchedule[3])();
        }
        goto LAB_00121dbc;
      }
      local_15b8 = true;
      innards::HomomorphismModel::add_extra_stats
                ((HomomorphismModel *)local_1658._M_unused._0_8_,
                 (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_15f8);
      goto LAB_001234fd;
    }
    iVar44 = (*((pHVar40->restarts_schedule)._M_t.
                super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                ._M_t.
                super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
                .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
               _vptr_RestartsSchedule[5])();
    if ((char)iVar44 == '\0') {
      pUVar37 = (UnsupportedConfiguration *)__cxa_allocate_exception(0x28);
      local_1468._0_8_ = local_1458;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1468,"Threaded search requires restarts","");
      UnsupportedConfiguration::UnsupportedConfiguration(pUVar37,(string *)local_1468);
      __cxa_throw(pUVar37,&UnsupportedConfiguration::typeinfo,
                  UnsupportedConfiguration::~UnsupportedConfiguration);
    }
    uVar42 = innards::how_many_threads(pHVar40->n_threads);
    _Var50._M_pi = local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    local_1478 = (pointer)local_16b8.
                          super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Stack_1470 = local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi;
    if (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi)->_M_use_count =
             (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi)->_M_use_count + 1;
      }
    }
    local_1620 = (_Base_ptr)(local_1638 + 8);
    local_1721._1_4_ = uVar42;
    local_1680._M_dataplus._M_p = (pointer)&local_1680.field_2;
    local_15a8._M_dataplus._M_p = (pointer)&local_15a8.field_2;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
    local_1718._M_impl._0_32_ = ZEXT832(0) << 0x20;
    local_1638._8_8_ = local_1638._8_8_ & 0xffffffff00000000;
    local_1628 = (_Base_ptr)0x0;
    local_15f8._0_8_ = local_15f8;
    local_1610 = ZEXT816(0) << 0x20;
    local_1680._M_string_length = 0;
    local_15a8._M_string_length = 0;
    local_1680.field_2._M_allocated_capacity =
         local_1680.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_15a8.field_2._M_allocated_capacity =
         local_15a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    local_1468._8_8_ = local_1468._8_8_ & 0xffffffffffffff00;
    local_1600 = 0;
    local_15e8 = (_List_node_base *)0x0;
    local_15d8.la[0] = 0;
    local_15c8 = 1;
    local_15c4._0_1_ = false;
    local_15c4._1_1_ = true;
    local_15c2 = false;
    local_15b8 = false;
    p_Stack_1618 = local_1620;
    local_15f8._8_8_ = local_15f8._0_8_;
    innards::SVOBitset::SVOBitset((SVOBitset *)local_1458,local_14e0.target_size,0);
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::vector(&local_1550,(ulong)local_14e0.pattern_size,(value_type *)local_1468,
             (allocator_type *)&local_16a8);
    if ((0x10 < (uint)local_1408._M_payload._48_4_) && (local_1458 != (undefined1  [8])0x0)) {
      operator_delete__((void *)local_1458);
    }
    bVar17 = innards::HomomorphismModel::initialise_domains(&local_14e0,&local_1550);
    if (bVar17) {
      local_1498 = std::chrono::_V2::steady_clock::now();
      paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(local_1721._1_8_ & 0xffffffff);
      local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_1660 = _Var50._M_pi;
      std::vector<std::thread,_std::allocator<std::thread>_>::reserve
                (&local_1568,(size_type)paVar43);
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::vector(&local_1490,(size_type)paVar43,(allocator_type *)local_1468);
      local_1538.field_2._M_local_buf[9] = '\0';
      local_1538.field_2._M_allocated_capacity = 0;
      uVar46 = (long)paVar43 * 0x20 + 0x20U & 0xffffffffffffffc0;
      local_1538._M_dataplus._M_p = (pointer)paVar43;
      pvVar29 = operator_new__(uVar46);
      memset(pvVar29,0,uVar46);
      local_1588.field_2._M_local_buf[9] = '\0';
      local_1588.field_2._M_allocated_capacity = 0;
      local_1588._M_dataplus._M_p = (pointer)paVar43;
      local_1538._M_string_length = (size_type)pvVar29;
      pvVar29 = operator_new__(uVar46);
      memset(pvVar29,0,uVar46);
      uVar9 = local_1721._1_4_;
      local_1468._0_8_ = &aStack_1438;
      local_1721[0] = 0;
      local_1688 = 0;
      local_1468._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x1;
      local_1458 = (undefined1  [8])0x0;
      uStack_1450._0_4_ = (_Storage<unsigned_int,_true>)0x0;
      uStack_1450._4_1_ = false;
      uStack_1450._5_3_ = 0;
      local_1448 = 0x3f800000;
      local_16a8._M_dataplus._M_p = (pointer)0x0;
      local_16a8._M_string_length = 0;
      local_16a8.field_2._M_allocated_capacity = 0;
      local_16a8.field_2._8_8_ = 0;
      local_1440 = (__uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
                    )0x0;
      aStack_1438._M_allocated_capacity = 0;
      if (_Var50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Var50._M_pi)->_M_use_count = (_Var50._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Var50._M_pi)->_M_use_count = (_Var50._M_pi)->_M_use_count + 1;
        }
      }
      local_1658._M_unused._M_object = (void *)0x0;
      local_1658._8_8_ = (HomomorphismParams *)0x0;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1588._M_string_length = (size_type)pvVar29;
      local_1658._M_unused._M_object = operator_new(0x90);
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->_imp)._M_t.
      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
           (Imp *)&local_1490;
      *(vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
        **)&((HomomorphismModel *)local_1658._M_unused._0_8_)->max_graphs = &local_1550;
      *(vector<std::thread,_std::allocator<std::thread>_> **)
       &((HomomorphismModel *)local_1658._M_unused._0_8_)->target_size = &local_1568;
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_1658;
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_14e0;
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_16e0;
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = local_1478;
      (((HomomorphismModel *)local_1658._M_unused._0_8_)->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)p_Stack_1470;
      *(undefined4 *)
       &(((HomomorphismModel *)local_1658._M_unused._0_8_)->
        target_occur_less_thans_in_convenient_order).
        super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = uVar9;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->_imp)._M_t.
      super___uniq_ptr_impl<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      ._M_t.
      super__Tuple_impl<0UL,_gss::innards::HomomorphismModel::Imp_*,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
      .super__Head_base<0UL,_gss::innards::HomomorphismModel::Imp_*,_false>._M_head_impl =
           (Imp *)local_1638;
      *(_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
        **)&((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->max_graphs =
           &local_1718;
      *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
       &((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->target_size = &local_1680;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)&local_15a8;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)&local_1538;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      pattern_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_1588;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1721;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1468;
      (((HomomorphismModel *)((long)local_1658._M_unused._0_8_ + 0x48))->
      target_occur_less_thans_in_convenient_order).
      super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_16a8;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              std::
              _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
              ::_M_invoke;
      sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)
           std::
           _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
           ::_M_manager;
      if (local_16e0->delay_thread_creation == false) {
        paVar48 = (allocator_type *)
                  local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start;
        paVar31 = (allocator_type *)
                  local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish;
        if (uVar9 != 0) {
          iVar44 = 0;
          pHVar40 = local_16e0;
          do {
            ptVar15 = local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
            ptVar14 = local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            local_16d8._M_string_length = (size_type)&local_1658;
            local_16d8._M_dataplus._M_p._0_4_ = iVar44;
            if (local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              if ((long)local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
                std::__throw_length_error("vector::_M_realloc_insert");
              }
              uVar47 = (long)local_1568.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_finish -
                       (long)local_1568.
                             super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                             super__Vector_impl_data._M_start >> 3;
              uVar30 = uVar47 + (uVar47 == 0);
              uVar46 = uVar30 + uVar47;
              if (0xffffffffffffffe < uVar46) {
                uVar46 = 0xfffffffffffffff;
              }
              if (CARRY8(uVar30,uVar47)) {
                uVar46 = 0xfffffffffffffff;
              }
              if (uVar46 == 0) {
                paVar31 = (allocator_type *)0x0;
              }
              else {
                paVar31 = (allocator_type *)
                          __gnu_cxx::new_allocator<std::thread>::allocate
                                    ((new_allocator<std::thread> *)&local_1568,uVar46,(void *)0x0);
                pHVar40 = extraout_RDX_00;
              }
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                        (paVar31 + uVar47 * 8,(thread *)&local_16d8,
                         (anon_class_16_2_f4d75bda_for__M_head_impl *)pHVar40);
              paVar48 = paVar31;
              for (paVar32 = (allocator_type *)ptVar14; paVar32 != (allocator_type *)ptVar15;
                  paVar32 = paVar32 + 8) {
                *(native_handle_type *)paVar48 = (native_handle_type)*(id *)paVar32;
                *(id *)paVar32 = (id)0x0;
                paVar48 = paVar48 + 8;
              }
              pHVar40 = extraout_RDX_01;
              if ((allocator_type *)ptVar14 != (allocator_type *)0x0) {
                operator_delete(ptVar14,(long)local_1568.
                                              super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                        (long)ptVar14);
                pHVar40 = extraout_RDX_02;
              }
              local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)(paVar31 + uVar46 * 8);
              local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)paVar31;
            }
            else {
              std::allocator_traits<std::allocator<std::thread>>::
              construct<std::thread,(anonymous_namespace)::ThreadedSolver::solve()::_lambda()_1_>
                        ((allocator_type *)
                         local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(thread *)&local_16d8,
                         (anon_class_16_2_f4d75bda_for__M_head_impl *)pHVar40);
              pHVar40 = extraout_RDX;
              paVar48 = (allocator_type *)
                        local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
            super__Vector_impl_data._M_finish = (pointer)(paVar48 + 8);
            iVar44 = iVar44 + 1;
            paVar48 = (allocator_type *)
                      local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start;
            paVar31 = (allocator_type *)
                      local_1568.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish;
          } while (iVar44 != local_1721._1_4_);
        }
        for (; paVar48 != paVar31; paVar48 = paVar48 + 8) {
          std::thread::join();
        }
      }
      else {
        local_16d8._M_dataplus._M_p = local_16d8._M_dataplus._M_p & 0xffffffff00000000;
        std::
        _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ciaranm[P]glasgow-subgraph-solver/gss/homomorphism.cc:250:17)>
        ::_M_invoke(&local_1658,(uint *)&local_16d8);
      }
      std::operator+(&local_16d8,"by_thread_nodes =",&local_1680);
      p_Var34 = (_List_node_base *)operator_new(0x30);
      sVar13 = local_16d8._M_string_length;
      paVar43 = &local_16d8.field_2;
      p_Var34[1]._M_next = p_Var34 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p == paVar43) {
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
        p_Var34[2]._M_prev = (_List_node_base *)local_16d8.field_2._8_8_;
      }
      else {
        p_Var34[1]._M_next = (_List_node_base *)local_16d8._M_dataplus._M_p;
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
      }
      local_16d8._M_string_length = 0;
      local_16d8.field_2._M_allocated_capacity =
           local_16d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      p_Var34[1]._M_prev = (_List_node_base *)sVar13;
      local_16d8._M_dataplus._M_p = (pointer)paVar43;
      std::__detail::_List_node_base::_M_hook(p_Var34);
      local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p != paVar43) {
        operator_delete(local_16d8._M_dataplus._M_p,
                        (ulong)(local_16d8.field_2._M_allocated_capacity + 1));
      }
      std::operator+(&local_16d8,"by_thread_propagations =",&local_15a8);
      p_Var34 = (_List_node_base *)operator_new(0x30);
      sVar13 = local_16d8._M_string_length;
      p_Var34[1]._M_next = p_Var34 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p == paVar43) {
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
        p_Var34[2]._M_prev = (_List_node_base *)local_16d8.field_2._8_8_;
      }
      else {
        p_Var34[1]._M_next = (_List_node_base *)local_16d8._M_dataplus._M_p;
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
      }
      local_16d8._M_string_length = 0;
      local_16d8.field_2._M_allocated_capacity =
           local_16d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      p_Var34[1]._M_prev = (_List_node_base *)sVar13;
      local_16d8._M_dataplus._M_p = (pointer)paVar43;
      std::__detail::_List_node_base::_M_hook(p_Var34);
      local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p != paVar43) {
        operator_delete(local_16d8._M_dataplus._M_p,local_16d8.field_2._M_allocated_capacity + 1);
      }
      lVar28 = std::chrono::_V2::steady_clock::now();
      lVar28 = lVar28 - local_1498;
      uVar42 = 1;
      uVar46 = lVar28 / 1000000;
      uVar30 = -uVar46;
      if (0 < (long)uVar46) {
        uVar30 = uVar46;
      }
      if (9 < uVar30) {
        uVar46 = uVar30;
        uVar23 = 4;
        do {
          uVar42 = uVar23;
          if (uVar46 < 100) {
            uVar42 = uVar42 - 2;
            goto LAB_00122565;
          }
          if (uVar46 < 1000) {
            uVar42 = uVar42 - 1;
            goto LAB_00122565;
          }
          if (uVar46 < 10000) goto LAB_00122565;
          bVar17 = 99999 < uVar46;
          uVar46 = uVar46 / 10000;
          uVar23 = uVar42 + 4;
        } while (bVar17);
        uVar42 = uVar42 + 1;
      }
LAB_00122565:
      local_1518._0_8_ = (pointer)(local_1518 + 0x10);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1518,
                 (ulong)((lVar28 < -999999) + uVar42),'-');
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)(local_1518._0_8_ + (ulong)(lVar28 < -999999)),uVar42,uVar30);
      pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_1518,0,0,"search_time = ",0xe);
      _Var50._M_pi = local_1660;
      paVar38 = &pbVar33->field_2;
      local_16d8._M_dataplus._M_p = (pbVar33->_M_dataplus)._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p == paVar38) {
        local_16d8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
        local_16d8.field_2._8_8_ = *(undefined8 *)((long)&pbVar33->field_2 + 8);
        local_16d8._M_dataplus._M_p = (pointer)paVar43;
      }
      else {
        local_16d8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
      }
      local_16d8._M_string_length = pbVar33->_M_string_length;
      (pbVar33->_M_dataplus)._M_p = (pointer)paVar38;
      pbVar33->_M_string_length = 0;
      (pbVar33->field_2)._M_local_buf[0] = '\0';
      p_Var34 = (_List_node_base *)operator_new(0x30);
      sVar13 = local_16d8._M_string_length;
      p_Var34[1]._M_next = p_Var34 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p == paVar43) {
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
        p_Var34[2]._M_prev = (_List_node_base *)local_16d8.field_2._8_8_;
      }
      else {
        p_Var34[1]._M_next = (_List_node_base *)local_16d8._M_dataplus._M_p;
        p_Var34[2]._M_next = (_List_node_base *)local_16d8.field_2._M_allocated_capacity;
      }
      local_16d8._M_string_length = 0;
      local_16d8.field_2._M_allocated_capacity =
           local_16d8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      p_Var34[1]._M_prev = (_List_node_base *)sVar13;
      local_16d8._M_dataplus._M_p = (pointer)paVar43;
      std::__detail::_List_node_base::_M_hook(p_Var34);
      local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_16d8._M_dataplus._M_p != paVar43) {
        operator_delete(local_16d8._M_dataplus._M_p,
                        (ulong)(local_16d8.field_2._M_allocated_capacity + 1));
      }
      if ((pointer)local_1518._0_8_ != (pointer)(local_1518 + 0x10)) {
        operator_delete((void *)local_1518._0_8_,(ulong)(local_1518._16_8_ + 1));
      }
      if ((pointer)sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr != (pointer)0x0) {
        (*(code *)sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)(&local_1658,&local_1658,3);
      }
      std::
      _Hashtable<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::clear((_Hashtable<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>,_std::allocator<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_std::__detail::_Identity,_std::equal_to<std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>_>,_(anonymous_namespace)::VertexToVertexMappingHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
               *)local_1468);
      if (&aStack_1438 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1468._0_8_) {
        operator_delete((void *)local_1468._0_8_,local_1468._8_8_ << 3);
      }
      if ((void *)local_1588._M_string_length != (void *)0x0) {
        operator_delete__(local_1588._M_string_length,0x40);
      }
      if ((void *)local_1538._M_string_length != (void *)0x0) {
        operator_delete__(local_1538._M_string_length,0x40);
      }
      std::
      vector<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>,_std::allocator<std::unique_ptr<gss::innards::HomomorphismSearcher,_std::default_delete<gss::innards::HomomorphismSearcher>_>_>_>
      ::~vector(&local_1490);
      std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_1568);
    }
    else {
      local_15b8 = true;
    }
    std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
    ::~vector(&local_1550);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_15a8._M_dataplus._M_p != &local_15a8.field_2) {
      operator_delete(local_15a8._M_dataplus._M_p,local_15a8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1680._M_dataplus._M_p != &local_1680.field_2) {
      operator_delete(local_1680._M_dataplus._M_p,
                      (ulong)(local_1680.field_2._M_allocated_capacity + 1));
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
             *)__return_storage_ptr__);
    if (local_1628 != (_Base_ptr)0x0) {
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           local_1638._8_4_;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
           local_1628;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           local_1620;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           p_Stack_1618;
      local_1628->_M_parent = local_14f8;
      (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
           local_1610._0_8_;
      local_1628 = (_Base_ptr)0x0;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = local_1610._8_8_;
      local_1610 = auVar6 << 0x40;
      local_1620 = (_Base_ptr)(local_1638 + 8);
      p_Stack_1618 = (_Base_ptr)(local_1638 + 8);
    }
    __return_storage_ptr__->nodes = local_1610._8_8_;
    __return_storage_ptr__->propagations = local_1600;
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_move_assign(local_14e8,local_15f8);
    boost::multiprecision::backends::
    cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
    ::operator=(local_14f0,
                (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
                 *)&local_15d8.ld);
    __return_storage_ptr__->complete = local_15b8;
    if ((local_15c4._1_1_ == false) && (local_15c2 == false)) {
      operator_delete(local_15d8.ld.data,(local_15d8.la[0] & 0xffffffff) << 3);
    }
    std::__cxx11::
    _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_15f8);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                 *)local_1638);
    goto joined_r0x00123608;
  }
  p_Var27 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            _M_create_node<char_const(&)[25]>
                      ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)plVar3,
                       (char (*) [25])"model_consistent = false");
  std::__detail::_List_node_base::_M_hook(&p_Var27->super__List_node_base);
  psVar2 = &(__return_storage_ptr__->extra_stats).
            super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl._M_node._M_size;
  *psVar2 = *psVar2 + 1;
  __return_storage_ptr__->complete = true;
  if ((pointer)local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (pointer)0x0) {
    innards::Proof::finish_unsat_proof
              (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
              );
  }
LAB_0012364b:
  innards::HomomorphismModel::~HomomorphismModel(&local_14e0);
LAB_00123658:
  if (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
LAB_00121dac:
  local_1550.
  super__Vector_base<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
  ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
  local_15b8 = true;
LAB_00121dbc:
  iVar44 = (*((((unique_ptr<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_> *)
               (local_1658._8_8_ + 0x50))->_M_t).
              super___uniq_ptr_impl<gss::RestartsSchedule,_std::default_delete<gss::RestartsSchedule>_>
              ._M_t.
              super__Tuple_impl<0UL,_gss::RestartsSchedule_*,_std::default_delete<gss::RestartsSchedule>_>
              .super__Head_base<0UL,_gss::RestartsSchedule_*,_false>._M_head_impl)->
             _vptr_RestartsSchedule[5])();
  if ((char)iVar44 != '\0') {
    uVar23 = 1;
    if (9 < uVar42) {
      uVar46 = (ulong)uVar42;
      uVar45 = 4;
      do {
        uVar23 = uVar45;
        uVar39 = (uint)uVar46;
        if (uVar39 < 100) {
          uVar23 = uVar23 - 2;
          goto LAB_001228d5;
        }
        if (uVar39 < 1000) {
          uVar23 = uVar23 - 1;
          goto LAB_001228d5;
        }
        if (uVar39 < 10000) goto LAB_001228d5;
        uVar46 = uVar46 / 10000;
        uVar45 = uVar23 + 4;
      } while (99999 < uVar39);
      uVar23 = uVar23 + 1;
    }
LAB_001228d5:
    local_16a8._M_dataplus._M_p = (pointer)&local_16a8.field_2;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_16a8,(ulong)uVar23,'\0');
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_16a8._M_dataplus._M_p,(uint)local_16a8._M_string_length,uVar42);
    pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_16a8,0,0,"restarts = ",0xb);
    auVar10 = (undefined1  [32])local_1718._M_impl._0_32_;
    pp_Var8 = &local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
    paVar43 = &pbVar33->field_2;
    auVar12 = (undefined1  [24])local_1718._M_impl.super__Rb_tree_header._M_header._0_24_;
    local_1718._M_impl._0_8_ = pp_Var8;
    auVar11 = (undefined1  [32])local_1718._M_impl._0_32_;
    local_1718._M_impl._0_8_ = (pbVar33->_M_dataplus)._M_p;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_left = auVar10._24_8_;
    p_Var26 = local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1718._M_impl._0_8_ == paVar43) {
      local_1718._M_impl._0_16_ = auVar11._0_16_;
      local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)paVar43->_M_allocated_capacity;
      local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)*(_Invoker_type *)((long)&pbVar33->field_2 + 8);
    }
    else {
      local_1718._M_impl._0_32_ = CONCAT248(auVar12,local_1718._M_impl._0_8_);
      local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)paVar43->_M_allocated_capacity;
      local_1718._M_impl._0_32_ = CONCAT824(p_Var26,local_1718._M_impl._0_24_);
    }
    local_1718._M_impl.super__Rb_tree_header._M_header._0_8_ = pbVar33->_M_string_length;
    (pbVar33->_M_dataplus)._M_p = (pointer)paVar43;
    pbVar33->_M_string_length = 0;
    (pbVar33->field_2)._M_local_buf[0] = '\0';
    p_Var34 = (_List_node_base *)operator_new(0x30);
    p_Var34[1]._M_next = p_Var34 + 2;
    if ((_Base_ptr *)local_1718._M_impl._0_8_ == pp_Var8) {
      p_Var34[2]._M_next =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var34[2]._M_prev =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var34[1]._M_next = (_List_node_base *)local_1718._M_impl._0_8_;
      p_Var34[2]._M_next =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    uVar25 = local_1718._M_impl.super__Rb_tree_header._M_header._0_8_;
    local_1718._M_impl._0_17_ = ZEXT817(pp_Var8);
    p_Var34[1]._M_prev = (_List_node_base *)uVar25;
    std::__detail::_List_node_base::_M_hook(p_Var34);
    local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
    if ((_Base_ptr *)local_1718._M_impl._0_8_ != pp_Var8) {
      operator_delete((void *)local_1718._M_impl._0_8_,
                      (ulong)((long)&(local_1718._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16a8._M_dataplus._M_p != &local_16a8.field_2) {
      operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
    }
  }
  uVar42 = *(uint *)(local_1658._M_unused._M_function_pointer + 8);
  uVar23 = 1;
  if (9 < uVar42) {
    uVar45 = 4;
    uVar39 = uVar42;
    do {
      uVar23 = uVar45;
      if (uVar39 < 100) {
        uVar23 = uVar23 - 2;
        goto LAB_00122a5f;
      }
      if (uVar39 < 1000) {
        uVar23 = uVar23 - 1;
        goto LAB_00122a5f;
      }
      if (uVar39 < 10000) goto LAB_00122a5f;
      bVar17 = 99999 < uVar39;
      uVar45 = uVar23 + 4;
      uVar39 = uVar39 / 10000;
    } while (bVar17);
    uVar23 = uVar23 + 1;
  }
LAB_00122a5f:
  paVar43 = &local_16a8.field_2;
  local_16a8._M_dataplus._M_p = (pointer)paVar43;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_16a8,(ulong)uVar23,'\0');
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_16a8._M_dataplus._M_p,(uint)local_16a8._M_string_length,uVar42);
  pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_16a8,0,0,"shape_graphs = ",0xf);
  auVar10 = (undefined1  [32])local_1718._M_impl._0_32_;
  pp_Var8 = &local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
  paVar38 = &pbVar33->field_2;
  auVar12 = (undefined1  [24])local_1718._M_impl.super__Rb_tree_header._M_header._0_24_;
  local_1718._M_impl._0_8_ = pp_Var8;
  auVar11 = (undefined1  [32])local_1718._M_impl._0_32_;
  local_1718._M_impl._0_8_ = (pbVar33->_M_dataplus)._M_p;
  local_1718._M_impl.super__Rb_tree_header._M_header._M_left = auVar10._24_8_;
  p_Var26 = local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_impl._0_8_ == paVar38) {
    local_1718._M_impl._0_16_ = auVar11._0_16_;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)paVar38->_M_allocated_capacity;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)*(_Invoker_type *)((long)&pbVar33->field_2 + 8);
  }
  else {
    local_1718._M_impl._0_32_ = CONCAT248(auVar12,local_1718._M_impl._0_8_);
    local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)paVar38->_M_allocated_capacity;
    local_1718._M_impl._0_32_ = CONCAT824(p_Var26,local_1718._M_impl._0_24_);
  }
  local_1718._M_impl.super__Rb_tree_header._M_header._0_8_ = pbVar33->_M_string_length;
  (pbVar33->_M_dataplus)._M_p = (pointer)paVar38;
  pbVar33->_M_string_length = 0;
  (pbVar33->field_2)._M_local_buf[0] = '\0';
  p_Var34 = (_List_node_base *)operator_new(0x30);
  p_Var34[1]._M_next = p_Var34 + 2;
  if ((_Base_ptr *)local_1718._M_impl._0_8_ == pp_Var8) {
    p_Var34[2]._M_next =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var34[2]._M_prev =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var34[1]._M_next = (_List_node_base *)local_1718._M_impl._0_8_;
    p_Var34[2]._M_next =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  uVar25 = local_1718._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_1718._M_impl._0_17_ = ZEXT817(pp_Var8);
  p_Var34[1]._M_prev = (_List_node_base *)uVar25;
  std::__detail::_List_node_base::_M_hook(p_Var34);
  local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
  if ((_Base_ptr *)local_1718._M_impl._0_8_ != pp_Var8) {
    operator_delete((void *)local_1718._M_impl._0_8_,
                    (ulong)((long)&(local_1718._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a8._M_dataplus._M_p != paVar43) {
    operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
  }
  lVar35 = std::chrono::_V2::steady_clock::now();
  lVar35 = lVar35 - lVar28;
  uVar42 = 1;
  uVar46 = lVar35 / 1000000;
  uVar30 = -uVar46;
  if (0 < (long)uVar46) {
    uVar30 = uVar46;
  }
  if (9 < uVar30) {
    uVar46 = uVar30;
    uVar23 = 4;
    do {
      uVar42 = uVar23;
      if (uVar46 < 100) {
        uVar42 = uVar42 - 2;
        goto LAB_00122c27;
      }
      if (uVar46 < 1000) {
        uVar42 = uVar42 - 1;
        goto LAB_00122c27;
      }
      if (uVar46 < 10000) goto LAB_00122c27;
      bVar17 = 99999 < uVar46;
      uVar46 = uVar46 / 10000;
      uVar23 = uVar42 + 4;
    } while (bVar17);
    uVar42 = uVar42 + 1;
  }
LAB_00122c27:
  local_16a8._M_dataplus._M_p = (pointer)paVar43;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
            (&local_16a8,(ulong)((lVar35 < -999999) + uVar42),'-');
  std::__detail::__to_chars_10_impl<unsigned_long>
            (local_16a8._M_dataplus._M_p + (lVar35 < -999999),uVar42,uVar30);
  pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                      (&local_16a8,0,0,"search_time = ",0xe);
  auVar10 = (undefined1  [32])local_1718._M_impl._0_32_;
  auVar12 = (undefined1  [24])local_1718._M_impl.super__Rb_tree_header._M_header._0_24_;
  local_1718._M_impl._0_8_ = pp_Var8;
  auVar11 = (undefined1  [32])local_1718._M_impl._0_32_;
  paVar38 = &pbVar33->field_2;
  local_1718._M_impl._0_8_ = (pbVar33->_M_dataplus)._M_p;
  local_1718._M_impl.super__Rb_tree_header._M_header._M_left = auVar10._24_8_;
  p_Var26 = local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1718._M_impl._0_8_ == paVar38) {
    local_1718._M_impl._0_16_ = auVar11._0_16_;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)paVar38->_M_allocated_capacity;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
         (_Base_ptr)*(_Invoker_type *)((long)&pbVar33->field_2 + 8);
  }
  else {
    local_1718._M_impl._0_32_ = CONCAT248(auVar12,local_1718._M_impl._0_8_);
    local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
         (_Base_ptr)paVar38->_M_allocated_capacity;
    local_1718._M_impl._0_32_ = CONCAT824(p_Var26,local_1718._M_impl._0_24_);
  }
  local_1718._M_impl.super__Rb_tree_header._M_header._0_8_ = pbVar33->_M_string_length;
  (pbVar33->_M_dataplus)._M_p = (pointer)paVar38;
  pbVar33->_M_string_length = 0;
  (pbVar33->field_2)._M_local_buf[0] = '\0';
  p_Var34 = (_List_node_base *)operator_new(0x30);
  p_Var34[1]._M_next = p_Var34 + 2;
  if ((_Base_ptr *)local_1718._M_impl._0_8_ == pp_Var8) {
    p_Var34[2]._M_next =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var34[2]._M_prev =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
  }
  else {
    p_Var34[1]._M_next = (_List_node_base *)local_1718._M_impl._0_8_;
    p_Var34[2]._M_next =
         (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
  }
  uVar25 = local_1718._M_impl.super__Rb_tree_header._M_header._0_8_;
  local_1718._M_impl._0_17_ = ZEXT817(pp_Var8);
  p_Var34[1]._M_prev = (_List_node_base *)uVar25;
  std::__detail::_List_node_base::_M_hook(p_Var34);
  local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
  if ((_Base_ptr *)local_1718._M_impl._0_8_ != pp_Var8) {
    operator_delete((void *)local_1718._M_impl._0_8_,
                    (ulong)((long)&(local_1718._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_16a8._M_dataplus._M_p != paVar43) {
    operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
  }
  bVar17 = innards::might_have_watches((HomomorphismParams *)local_1658._8_8_);
  if (bVar17) {
    uVar42 = 1;
    if (9 < local_a0._M_impl._M_node._M_size) {
      sVar41 = local_a0._M_impl._M_node._M_size;
      uVar23 = 4;
      do {
        uVar42 = uVar23;
        if (sVar41 < 100) {
          uVar42 = uVar42 - 2;
          goto LAB_00122deb;
        }
        if (sVar41 < 1000) {
          uVar42 = uVar42 - 1;
          goto LAB_00122deb;
        }
        if (sVar41 < 10000) goto LAB_00122deb;
        bVar17 = 99999 < sVar41;
        sVar41 = sVar41 / 10000;
        uVar23 = uVar42 + 4;
      } while (bVar17);
      uVar42 = uVar42 + 1;
    }
LAB_00122deb:
    local_16a8._M_dataplus._M_p = (pointer)paVar43;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_construct
              (&local_16a8,(ulong)uVar42,'\0');
    std::__detail::__to_chars_10_impl<unsigned_long>
              (local_16a8._M_dataplus._M_p,(uint)local_16a8._M_string_length,
               local_a0._M_impl._M_node._M_size);
    pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              replace(&local_16a8,0,0,"nogoods_size = ",0xf);
    auVar10 = (undefined1  [32])local_1718._M_impl._0_32_;
    auVar12 = (undefined1  [24])local_1718._M_impl.super__Rb_tree_header._M_header._0_24_;
    local_1718._M_impl._0_8_ = pp_Var8;
    auVar11 = (undefined1  [32])local_1718._M_impl._0_32_;
    paVar38 = &pbVar33->field_2;
    local_1718._M_impl._0_8_ = (pbVar33->_M_dataplus)._M_p;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_left = auVar10._24_8_;
    p_Var26 = local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1718._M_impl._0_8_ == paVar38) {
      local_1718._M_impl._0_16_ = auVar11._0_16_;
      local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)paVar38->_M_allocated_capacity;
      local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
           (_Base_ptr)*(_Invoker_type *)((long)&pbVar33->field_2 + 8);
    }
    else {
      local_1718._M_impl._0_32_ = CONCAT248(auVar12,local_1718._M_impl._0_8_);
      local_1718._M_impl.super__Rb_tree_header._M_header._M_parent =
           (_Base_ptr)paVar38->_M_allocated_capacity;
      local_1718._M_impl._0_32_ = CONCAT824(p_Var26,local_1718._M_impl._0_24_);
    }
    local_1718._M_impl.super__Rb_tree_header._M_header._0_8_ = pbVar33->_M_string_length;
    (pbVar33->_M_dataplus)._M_p = (pointer)paVar38;
    pbVar33->_M_string_length = 0;
    (pbVar33->field_2)._M_local_buf[0] = '\0';
    p_Var34 = (_List_node_base *)operator_new(0x30);
    p_Var34[1]._M_next = p_Var34 + 2;
    if ((_Base_ptr *)local_1718._M_impl._0_8_ == pp_Var8) {
      p_Var34[2]._M_next =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var34[2]._M_prev =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
    }
    else {
      p_Var34[1]._M_next = (_List_node_base *)local_1718._M_impl._0_8_;
      p_Var34[2]._M_next =
           (_List_node_base *)local_1718._M_impl.super__Rb_tree_header._M_header._M_parent;
    }
    uVar25 = local_1718._M_impl.super__Rb_tree_header._M_header._0_8_;
    local_1718._M_impl._0_17_ = ZEXT817(pp_Var8);
    p_Var34[1]._M_prev = (_List_node_base *)uVar25;
    std::__detail::_List_node_base::_M_hook(p_Var34);
    local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
    if ((_Base_ptr *)local_1718._M_impl._0_8_ != pp_Var8) {
      operator_delete((void *)local_1718._M_impl._0_8_,
                      (ulong)((long)&(local_1718._M_impl.super__Rb_tree_header._M_header._M_parent)
                                     ->_M_color + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16a8._M_dataplus._M_p != paVar43) {
      operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
    }
    local_1718._M_impl.super__Rb_tree_header._M_header._M_right =
         &local_1718._M_impl.super__Rb_tree_header._M_header;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_1718._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1718._M_impl.super__Rb_tree_header._M_header._M_right;
    local_1718._M_impl.super__Rb_tree_header._M_node_count = 0;
    if (local_a0._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&local_a0) {
      local_16a8._M_dataplus._M_p = (pointer)&local_16a8.field_2;
      local_16a8._M_string_length = 0;
      local_16a8.field_2._M_allocated_capacity =
           local_16a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
    }
    else {
      p_Var34 = local_a0._M_impl._M_node.super__List_node_base._M_next;
      do {
        local_16a8._M_dataplus._M_p._0_4_ =
             (int)((ulong)((long)p_Var34[1]._M_prev - (long)p_Var34[1]._M_next) >> 3);
        pmVar36 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                  operator[]((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                              *)&local_1718,(key_type *)&local_16a8);
        *pmVar36 = *pmVar36 + 1;
        p_Var34 = (((_List_impl *)&p_Var34->_M_next)->_M_node).super__List_node_base._M_next;
      } while (p_Var34 != (_List_node_base *)&local_a0);
      local_16a8._M_string_length = 0;
      local_16a8.field_2._M_allocated_capacity =
           local_16a8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_16a8._M_dataplus._M_p = (pointer)paVar43;
      if ((_Rb_tree_header *)local_1718._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_1718._M_impl.super__Rb_tree_header) {
        p_Var26 = local_1718._M_impl.super__Rb_tree_header._M_header._M_left;
        local_1721._1_8_ = paVar43;
        do {
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                    (&local_16a8," ");
          _Var4 = p_Var26[1]._M_color;
          uVar42 = 1;
          __val = -_Var4;
          if (0 < (int)_Var4) {
            __val = _Var4;
          }
          if (9 < __val) {
            uVar46 = (ulong)__val;
            uVar23 = 4;
            do {
              uVar42 = uVar23;
              uVar45 = (uint)uVar46;
              if (uVar45 < 100) {
                uVar42 = uVar42 - 2;
                goto LAB_00123045;
              }
              if (uVar45 < 1000) {
                uVar42 = uVar42 - 1;
                goto LAB_00123045;
              }
              if (uVar45 < 10000) goto LAB_00123045;
              uVar46 = uVar46 / 10000;
              uVar23 = uVar42 + 4;
            } while (99999 < uVar45);
            uVar42 = uVar42 + 1;
          }
LAB_00123045:
          local_1538._M_dataplus._M_p = (pointer)&local_1538.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_1538,(ulong)(uVar42 + -((int)_Var4 >> 0x1f)),'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_1538._M_dataplus._M_p + (uint)-((int)_Var4 >> 0x1f),uVar42,__val);
          pbVar33 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::append(&local_1538,":");
          local_15a8._M_dataplus._M_p = (pointer)&local_15a8.field_2;
          paVar38 = &pbVar33->field_2;
          paVar43 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(pbVar33->_M_dataplus)._M_p;
          if (paVar43 == paVar38) {
            local_15a8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
            local_15a8.field_2._8_8_ = *(undefined8 *)((long)&pbVar33->field_2 + 8);
          }
          else {
            local_15a8.field_2._M_allocated_capacity = paVar38->_M_allocated_capacity;
            local_15a8._M_dataplus._M_p = (pointer)paVar43;
          }
          local_15a8._M_string_length = pbVar33->_M_string_length;
          uVar45 = 1;
          (pbVar33->_M_dataplus)._M_p = (pointer)paVar38;
          pbVar33->_M_string_length = 0;
          (pbVar33->field_2)._M_local_buf[0] = '\0';
          uVar42 = *(uint *)&p_Var26[1].field_0x4;
          uVar23 = -uVar42;
          if (0 < (int)uVar42) {
            uVar23 = uVar42;
          }
          if (9 < uVar23) {
            uVar46 = (ulong)uVar23;
            uVar39 = 4;
            do {
              uVar45 = uVar39;
              uVar24 = (uint)uVar46;
              if (uVar24 < 100) {
                uVar45 = uVar45 - 2;
                goto LAB_00123147;
              }
              if (uVar24 < 1000) {
                uVar45 = uVar45 - 1;
                goto LAB_00123147;
              }
              if (uVar24 < 10000) goto LAB_00123147;
              uVar46 = uVar46 / 10000;
              uVar39 = uVar45 + 4;
            } while (99999 < uVar24);
            uVar45 = uVar45 + 1;
          }
LAB_00123147:
          local_1588._M_dataplus._M_p = (pointer)&local_1588.field_2;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_construct(&local_1588,(ulong)(uVar45 + -((int)uVar42 >> 0x1f)),'-');
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_1588._M_dataplus._M_p + (uint)-((int)uVar42 >> 0x1f),uVar45,uVar23);
          uVar25 = 0xf;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15a8._M_dataplus._M_p != &local_15a8.field_2) {
            uVar25 = local_15a8.field_2._M_allocated_capacity;
          }
          if ((ulong)uVar25 < local_1588._M_string_length + local_15a8._M_string_length) {
            uVar25 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1588._M_dataplus._M_p != &local_1588.field_2) {
              uVar25 = local_1588.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar25 < local_1588._M_string_length + local_15a8._M_string_length)
            goto LAB_001231f7;
            pbVar33 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                                (&local_1588,0,0,local_15a8._M_dataplus._M_p,
                                 local_15a8._M_string_length);
          }
          else {
LAB_001231f7:
            pbVar33 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                                (&local_15a8,local_1588._M_dataplus._M_p,local_1588._M_string_length
                                );
          }
          paVar43 = &pbVar33->field_2;
          local_1680._M_dataplus._M_p = (pbVar33->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1680._M_dataplus._M_p == paVar43) {
            local_1680.field_2._M_allocated_capacity = paVar43->_M_allocated_capacity;
            local_1680.field_2._8_8_ = *(undefined8 *)((long)&pbVar33->field_2 + 8);
            local_1680._M_dataplus._M_p = (pointer)&local_1680.field_2;
          }
          else {
            local_1680.field_2._M_allocated_capacity = paVar43->_M_allocated_capacity;
          }
          local_1680._M_string_length = pbVar33->_M_string_length;
          (pbVar33->_M_dataplus)._M_p = (pointer)paVar43;
          pbVar33->_M_string_length = 0;
          paVar43->_M_local_buf[0] = '\0';
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                    (&local_16a8,local_1680._M_dataplus._M_p,local_1680._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1680._M_dataplus._M_p != &local_1680.field_2) {
            operator_delete(local_1680._M_dataplus._M_p,
                            (ulong)(local_1680.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1588._M_dataplus._M_p != &local_1588.field_2) {
            operator_delete(local_1588._M_dataplus._M_p,local_1588.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_15a8._M_dataplus._M_p != &local_15a8.field_2) {
            operator_delete(local_15a8._M_dataplus._M_p,local_15a8.field_2._M_allocated_capacity + 1
                           );
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1538._M_dataplus._M_p != &local_1538.field_2) {
            operator_delete(local_1538._M_dataplus._M_p,local_1538.field_2._M_allocated_capacity + 1
                           );
          }
          p_Var26 = (_Base_ptr)std::_Rb_tree_increment(p_Var26);
        } while ((_Rb_tree_header *)p_Var26 != &local_1718._M_impl.super__Rb_tree_header);
      }
    }
    std::operator+(&local_1680,"nogoods_lengths =",&local_16a8);
    p_Var34 = (_List_node_base *)operator_new(0x30);
    sVar13 = local_1680._M_string_length;
    paVar43 = &local_1680.field_2;
    p_Var34[1]._M_next = p_Var34 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1680._M_dataplus._M_p == paVar43) {
      p_Var34[2]._M_next = (_List_node_base *)local_1680.field_2._M_allocated_capacity;
      p_Var34[2]._M_prev = (_List_node_base *)local_1680.field_2._8_8_;
    }
    else {
      p_Var34[1]._M_next = (_List_node_base *)local_1680._M_dataplus._M_p;
      p_Var34[2]._M_next = (_List_node_base *)local_1680.field_2._M_allocated_capacity;
    }
    local_1680._M_string_length = 0;
    local_1680.field_2._M_allocated_capacity =
         local_1680.field_2._M_allocated_capacity & 0xffffffffffffff00;
    p_Var34[1]._M_prev = (_List_node_base *)sVar13;
    local_1680._M_dataplus._M_p = (pointer)paVar43;
    std::__detail::_List_node_base::_M_hook(p_Var34);
    local_15e8 = (_List_node_base *)((long)&local_15e8->_M_next + 1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1680._M_dataplus._M_p != paVar43) {
      operator_delete(local_1680._M_dataplus._M_p,
                      (ulong)(local_1680.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_16a8._M_dataplus._M_p != &local_16a8.field_2) {
      operator_delete(local_16a8._M_dataplus._M_p,local_16a8.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::~_Rb_tree(&local_1718);
  }
  innards::HomomorphismModel::add_extra_stats
            ((HomomorphismModel *)local_1658._M_unused._0_8_,
             (list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_15f8);
  p_Var34 = local_50._M_next;
  while (p_Var34 != &local_50) {
    p_Var49 = p_Var34->_M_next;
    operator_delete(p_Var34,0x18);
    p_Var34 = p_Var49;
  }
  p_Var34 = local_68._M_next;
  while (p_Var34 != &local_68) {
    p_Var49 = p_Var34->_M_next;
    operator_delete(p_Var34,0x18);
    p_Var34 = p_Var49;
  }
  std::
  vector<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>,_std::allocator<std::__cxx11::list<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>,_std::allocator<std::_List_iterator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>_>_>_>
  ::~vector(&local_80);
  std::__cxx11::
  _List_base<gss::innards::Nogood<gss::innards::HomomorphismAssignment>,_std::allocator<gss::innards::Nogood<gss::innards::HomomorphismAssignment>_>_>
  ::_M_clear(&local_a0);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(aStack_1438._9_7_,aStack_1438._M_local_buf[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(aStack_1438._9_7_,aStack_1438._M_local_buf[8]));
  }
  if ((code *)CONCAT44(uStack_1444,local_1448) != (code *)0x0) {
    (*(code *)CONCAT44(uStack_1444,local_1448))(local_1458,local_1458,3);
  }
  if ((pointer)local_1518._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_1518._0_8_,local_1518._16_8_ - local_1518._0_8_);
  }
LAB_001234fd:
  std::vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>::
  ~vector((vector<gss::innards::HomomorphismDomain,_std::allocator<gss::innards::HomomorphismDomain>_>
           *)&local_16d8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::clear((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
           *)__return_storage_ptr__);
  if (local_1628 != (_Base_ptr)0x0) {
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         local_1638._8_4_;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
         local_1628;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         local_1620;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         p_Stack_1618;
    local_1628->_M_parent = local_14f8;
    (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count =
         local_1610._0_8_;
    local_1628 = (_Base_ptr)0x0;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_1610._8_8_;
    local_1610 = auVar7 << 0x40;
    local_1620 = (_Base_ptr)(local_1638 + 8);
    p_Stack_1618 = (_Base_ptr)(local_1638 + 8);
  }
  __return_storage_ptr__->nodes = local_1610._8_8_;
  __return_storage_ptr__->propagations = local_1600;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_move_assign(local_14e8,local_15f8);
  boost::multiprecision::backends::
  cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
  ::operator=(local_14f0,
              (cpp_int_base<0U,_4294967295U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>,_false>
               *)&local_15d8.ld);
  __return_storage_ptr__->complete = local_15b8;
  if ((local_15c4._1_1_ == false) && (local_15c2 == false)) {
    operator_delete(local_15d8.ld.data,(local_15d8.la[0] & 0xffffffff) << 3);
  }
  std::__cxx11::
  _List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::_M_clear((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_15f8);
  std::
  _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
  ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
               *)local_1638);
  _Var50._M_pi = sStack_1648.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi;
joined_r0x00123608:
  if (_Var50._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var50._M_pi);
  }
  if ((pointer)local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>._M_ptr
      != (pointer)0x0) {
    sVar41 = (__return_storage_ptr__->mapping)._M_t._M_impl.super__Rb_tree_header._M_node_count;
    if (__return_storage_ptr__->complete == true) {
      if (sVar41 == 0) {
        innards::Proof::finish_unsat_proof
                  (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
      else {
LAB_0012363f:
        innards::Proof::finish_sat_proof
                  (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
      }
    }
    else {
      if (sVar41 != 0) goto LAB_0012363f;
      innards::Proof::finish_unknown_proof
                (local_16b8.super___shared_ptr<gss::innards::Proof,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr);
    }
  }
  goto LAB_0012364b;
}

Assistant:

auto gss::solve_homomorphism_problem(
    const InputGraph & pattern,
    const InputGraph & target,
    const HomomorphismParams & params) -> HomomorphismResult
{
    // start by setting up proof logging, if necessary
    shared_ptr<Proof> proof;
    if (params.proof_options) {
        // proof logging is currently incompatible with a whole load of "extra" features,
        // but can be adapted to support most of them
        if (1 != params.n_threads)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with threads"};
        if (params.clique_detection)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with clique detection, use --no-clique-detection"};
        if (params.lackey)
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with a lackey"};
        if (! params.pattern_less_constraints.empty() || ! params.target_occur_less_constraints.empty())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used with less-constraints"};
        if (params.injectivity != Injectivity::Injective && params.injectivity != Injectivity::NonInjective)
            throw UnsupportedConfiguration{"Proof logging can currently only be used with injectivity or non-injectivity"};
        if (pattern.has_vertex_labels() || pattern.has_edge_labels())
            throw UnsupportedConfiguration{"Proof logging cannot yet be used on labelled graphs"};

        proof = make_shared<Proof>(*params.proof_options);

        // set up our model file, with a set of OPB variables for each CP variable
        for (int n = 0; n < pattern.size(); ++n) {
            proof->create_cp_variable(
                n, target.size(),
                [&](int v) { return pattern.vertex_name(v); },
                [&](int v) { return target.vertex_name(v); });
        }

        // generate constraints for injectivity
        if (params.injectivity == Injectivity::Injective)
            proof->create_injectivity_constraints(pattern.size(), target.size());

        // generate edge constraints, and also handle loops here
        for (int p = 0; p < pattern.size(); ++p) {
            for (int t = 0; t < target.size(); ++t) {
                // it's simpler to always have the adjacency constraints, even
                // if the assignment is forbidden
                proof->start_adjacency_constraints_for(p, t);

                // if p can be mapped to t, then each neighbour of p...
                for (int q = 0; q < pattern.size(); ++q)
                    if (pattern.adjacent(p, q)) {
                        // ... must be mapped to a neighbour of t
                        vector<int> permitted, cancel_out;
                        for (int u = 0; u < target.size(); ++u)
                            if (target.adjacent(t, u)) {
                                permitted.push_back(u);
                                if (t == u)
                                    cancel_out.push_back(t);
                            }
                        proof->create_adjacency_constraint(p, q, t, permitted, cancel_out, false);
                    }

                // same for non-adjacency for induced
                if (params.induced) {
                    for (int q = 0; q < pattern.size(); ++q)
                        if (q != p && ! pattern.adjacent(p, q)) {
                            // ... must be mapped to a neighbour of t
                            vector<int> permitted;
                            for (int u = 0; u < target.size(); ++u)
                                if (t != u && ! target.adjacent(t, u))
                                    permitted.push_back(u);
                            proof->create_adjacency_constraint(p, q, t, permitted, vector<int>{}, true);
                        }
                }
            }
        }

        // output the model file
        proof->finalise_model();
    }

    // first sanity check: if we're finding an injective mapping, and there
    // aren't enough vertices, fail immediately.
    if (is_nonshrinking(params) && (pattern.size() > target.size())) {
        if (proof) {
            proof->failure_due_to_pattern_bigger_than_target();
            proof->finish_unsat_proof();
        }

        return HomomorphismResult{};
    }

    // does the target have loops, and are we looking for a single non-injective mapping?
    if ((params.injectivity == Injectivity::NonInjective) && ! pattern.has_vertex_labels() && ! pattern.has_edge_labels() && target.loopy() && ! params.count_solutions && ! params.enumerate_callback) {
        HomomorphismResult result;
        result.extra_stats.emplace_back("used_loops_property = true");
        result.complete = true;
        int loop = -1;
        for (int t = 0; t < target.size(); ++t)
            if (target.adjacent(t, t)) {
                loop = t;
                break;
            }

        for (int n = 0; n < pattern.size(); ++n)
            result.mapping.emplace(n, loop);

        ++result.solution_count;

        return result;
    }

    // is the pattern a clique? if so, use a clique algorithm instead
    if (can_use_clique(params) && is_simple_clique(pattern)) {
        CliqueParams clique_params;
        clique_params.timeout = params.timeout;
        clique_params.start_time = params.start_time;
        clique_params.decide = make_optional(pattern.size());
        clique_params.restarts_schedule = make_unique<NoRestartsSchedule>();
        auto clique_result = solve_clique_problem(target, clique_params);

        // now translate the result back into what we expect
        HomomorphismResult result;
        int v = 0;
        for (auto & m : clique_result.clique) {
            result.mapping.emplace(v++, m);
            // the clique solver can find a bigger clique than we ask for
            if (v >= pattern.size())
                break;
        }
        result.nodes = clique_result.nodes;
        result.extra_stats = move(clique_result.extra_stats);
        result.extra_stats.emplace_back("used_clique_solver = true");
        result.complete = clique_result.complete;

        return result;
    }
    else {
        // just solve the problem
        HomomorphismModel model(target, pattern, params, proof);

        if (! model.prepare()) {
            HomomorphismResult result;
            result.extra_stats.emplace_back("model_consistent = false");
            result.complete = true;
            if (proof)
                proof->finish_unsat_proof();
            return result;
        }

        HomomorphismResult result;
        if (1 == params.n_threads) {
            SequentialSolver solver(model, params, proof);
            result = solver.solve();
        }
        else {
            if (! params.restarts_schedule->might_restart())
                throw UnsupportedConfiguration{"Threaded search requires restarts"};

            unsigned n_threads = how_many_threads(params.n_threads);
            ThreadedSolver solver(model, params, proof, n_threads);
            result = solver.solve();
        }

        if (proof) {
            if (result.complete && result.mapping.empty())
                proof->finish_unsat_proof();
            else if (! result.mapping.empty())
                proof->finish_sat_proof();
            else
                proof->finish_unknown_proof();
        }

        return result;
    }
}